

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

bool medit_form(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  if (*argument != '\0') {
    pvVar1 = ch->desc->pEdit;
    iVar2 = flag_value(form_flags,argument);
    if (iVar2 != -99) {
      iVar3 = iVar2 + 0x1f;
      if (-1 < iVar2) {
        iVar3 = iVar2;
      }
      lVar5 = (long)(iVar3 >> 5);
      uVar4 = *(ulong *)((long)pvVar1 + lVar5 * 8 + 0x128);
      dVar6 = ldexp(1.0,iVar2 % 0x20);
      dVar7 = ldexp(1.0,iVar2 % 0x20);
      if ((uVar4 & (long)dVar6) == 0) {
        uVar4 = (long)dVar7 | *(ulong *)((long)pvVar1 + lVar5 * 8 + 0x128);
      }
      else {
        uVar4 = ~(long)dVar7 & *(ulong *)((long)pvVar1 + lVar5 * 8 + 0x128);
      }
      *(ulong *)((long)pvVar1 + lVar5 * 8 + 0x128) = uVar4;
      send_to_char("Form toggled.\n\r",ch);
      return true;
    }
  }
  send_to_char("Syntax: form [flags]\n\rType \'? form\' for a list of flags.\n\r",ch);
  return false;
}

Assistant:

bool medit_form(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int value;

	if (argument[0] != '\0')
	{
		EDIT_MOB(ch, pMob);

		value = flag_value(form_flags, argument);

		if (value != NO_FLAG)
		{
			TOGGLE_BIT(pMob->form, value);
			send_to_char("Form toggled.\n\r", ch);
			return true;
		}
	}

	send_to_char("Syntax: form [flags]\n\r"\
				 "Type '? form' for a list of flags.\n\r",
				 ch);
	return false;
}